

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

int decodeBase31(char *code)

{
  char cVar1;
  bool bVar2;
  int local_14;
  char *pcStack_10;
  int value;
  char *code_local;
  
  local_14 = 0;
  pcStack_10 = code;
  while( true ) {
    bVar2 = false;
    if (*pcStack_10 != '.') {
      bVar2 = *pcStack_10 != '\0';
    }
    if (!bVar2) break;
    cVar1 = decodeChar(*pcStack_10);
    local_14 = local_14 * 0x1f + (int)cVar1;
    pcStack_10 = pcStack_10 + 1;
  }
  return local_14;
}

Assistant:

static int decodeBase31(const char *code) {
    int value = 0;
    ASSERT(code);
    while (*code != '.' && *code != 0) {
        value = value * 31 + decodeChar(*code++);
    }
    return value;
}